

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRAccessChain * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::allocate<spirv_cross::SPIRAccessChain&>
          (ObjectPool<spirv_cross::SPIRAccessChain> *this,SPIRAccessChain *p)

{
  size_t sVar1;
  pointer pcVar2;
  bool bVar3;
  VariableID VVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  _Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
  _Var7;
  ulong uVar8;
  uint uVar9;
  _Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> _Var10;
  SPIRAccessChain *pSVar11;
  
  if ((this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size == 0) {
    uVar9 = this->start_object_count <<
            ((byte)(this->memory).
                   super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                   .buffer_size & 0x1f);
    uVar8 = (ulong)uVar9;
    _Var7.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl =
         (_Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>)malloc(uVar8 * 0xa8);
    if (_Var7.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl !=
        (SPIRAccessChain *)0x0) {
      _Var10._M_head_impl =
           (SPIRAccessChain *)
           _Var7.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
      if (uVar9 != 0) {
        do {
          SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::reserve
                    (&this->vacants,
                     (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size +
                     1);
          sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
          (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar1] =
               _Var10._M_head_impl;
          (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size = sVar1 + 1;
          uVar8 = uVar8 - 1;
          _Var10._M_head_impl = _Var10._M_head_impl + 1;
        } while (uVar8 != 0);
      }
      SmallVector<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
                .buffer_size + 1);
      sVar1 = (this->memory).
              super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
      .ptr[sVar1]._M_t.
      super___uniq_ptr_impl<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_spirv_cross::SPIRAccessChain_*,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>
      .super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false> =
           _Var7.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<spirv_cross::SPIRAccessChain,_spirv_cross::ObjectPool<spirv_cross::SPIRAccessChain>::MallocDeleter>_>
      .buffer_size = sVar1 + 1;
      if (_Var7.super__Head_base<0UL,_spirv_cross::SPIRAccessChain_*,_false>._M_head_impl !=
          (SPIRAccessChain *)0x0) goto LAB_002534e6;
    }
    pSVar11 = (SPIRAccessChain *)0x0;
  }
  else {
LAB_002534e6:
    sVar1 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.buffer_size;
    pSVar11 = (this->vacants).super_VectorView<spirv_cross::SPIRAccessChain_*>.ptr[sVar1 - 1];
    if (sVar1 != 0) {
      SmallVector<spirv_cross::SPIRAccessChain_*,_0UL>::resize(&this->vacants,sVar1 - 1);
    }
    (pSVar11->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003fd260;
    (pSVar11->super_IVariant).self.id = (p->super_IVariant).self.id;
    (pSVar11->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_003fd308;
    *(undefined8 *)&(pSVar11->super_IVariant).field_0xc =
         *(undefined8 *)&(p->super_IVariant).field_0xc;
    (pSVar11->base)._M_dataplus._M_p = (pointer)&(pSVar11->base).field_2;
    pcVar2 = (p->base)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar11->base,pcVar2,pcVar2 + (p->base)._M_string_length);
    (pSVar11->dynamic_index)._M_dataplus._M_p = (pointer)&(pSVar11->dynamic_index).field_2;
    pcVar2 = (p->dynamic_index)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&pSVar11->dynamic_index,pcVar2,pcVar2 + (p->dynamic_index)._M_string_length
              );
    bVar3 = p->immutable;
    pSVar11->row_major_matrix = p->row_major_matrix;
    pSVar11->immutable = bVar3;
    VVar4.id = (p->loaded_from).id;
    uVar5 = p->matrix_stride;
    uVar6 = p->array_stride;
    pSVar11->static_index = p->static_index;
    pSVar11->loaded_from = (VariableID)VVar4.id;
    pSVar11->matrix_stride = uVar5;
    pSVar11->array_stride = uVar6;
    (pSVar11->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)0x0;
    (pSVar11->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = 0;
    (pSVar11->implied_read_expressions).
    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr =
         (TypedID<(spirv_cross::Types)0> *)&(pSVar11->implied_read_expressions).stack_storage;
    (pSVar11->implied_read_expressions).buffer_capacity = 8;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&pSVar11->implied_read_expressions,&p->implied_read_expressions);
  }
  return pSVar11;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}